

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O3

void __thiscall World::World(World *this)

{
  File_logger *p;
  Datetime_formatter *this_00;
  string local_90;
  string local_70;
  shared_ptr<util::logging::Formatter> local_50;
  File_logger *local_40;
  
  this->_vptr_World = (_func_int **)&PTR__World_0011d4f8;
  (this->pops).
  super__Vector_base<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pops).
  super__Vector_base<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pops).
  super__Vector_base<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->oldpops).
  super__Vector_base<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>,_std::allocator<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->oldpops).
  super__Vector_base<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>,_std::allocator<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oldpops).
  super__Vector_base<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>,_std::allocator<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = (File_logger *)operator_new(0x60);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"genfunop.log","");
  this_00 = (Datetime_formatter *)operator_new(0x28);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"%Y-%m-%dT%H:%M:%S%z","");
  util::logging::Datetime_formatter::Datetime_formatter(this_00,&local_90);
  boost::shared_ptr<util::logging::Formatter>::shared_ptr<util::logging::Datetime_formatter>
            (&local_50,this_00);
  p = local_40;
  util::logging::File_logger::File_logger(local_40,&local_70,&local_50,0x7f);
  boost::shared_ptr<util::logging::File_logger>::shared_ptr<util::logging::File_logger>
            (&this->LOGFILE,p);
  boost::detail::shared_count::~shared_count(&local_50.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

World::World() :
	LOGFILE(new util::logging::File_logger())
{
}